

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_a27195::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char **ppcVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  PolicyStatus PVar9;
  int iVar10;
  BOM BVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  string *psVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  uint *puVar19;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  uint uVar20;
  uint uVar21;
  BOM BVar22;
  string *sr;
  pointer pbVar23;
  undefined1 uVar24;
  undefined4 uVar25;
  undefined8 unaff_RBP;
  char cVar26;
  size_type sVar27;
  cmExecutionStatus *pcVar28;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view value;
  int limit_output;
  string output;
  int limit_input;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  ifstream fin;
  RegularExpression regex;
  uint local_570;
  int local_56c;
  string *local_568;
  uint local_55c;
  undefined8 local_558;
  pointer local_550;
  string local_548;
  undefined8 local_528;
  int local_51c;
  ulong local_518;
  string local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  char *local_4d8;
  undefined8 local_4d0;
  cmExecutionStatus *local_4c8;
  ulong local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  uint local_49c;
  string local_498;
  pointer local_478;
  char *local_470;
  undefined1 local_468 [24];
  char local_450 [8];
  char *local_448;
  undefined8 local_440;
  RegularExpression local_260;
  
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) < 0x41) {
    ppcVar1 = local_260.regmatch.startp + 2;
    local_260.regmatch.startp[0] = (char *)ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"STRINGS requires a file name and output variable","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((char **)local_260.regmatch.startp[0] != ppcVar1) {
      operator_delete(local_260.regmatch.startp[0],(ulong)(local_260.regmatch.startp[2] + 1));
    }
    uVar24 = 0;
  }
  else {
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    pcVar2 = pbVar23[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_498,pcVar2,pcVar2 + pbVar23[1]._M_string_length);
    bVar6 = cmsys::SystemTools::FileIsFullPath(&local_498);
    if (!bVar6) {
      psVar15 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      pbVar23 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_260.regmatch.startp[1] = (psVar15->_M_dataplus)._M_p;
      local_260.regmatch.startp[0] = (char *)psVar15->_M_string_length;
      local_260.regmatch.startp[2] = (char *)0x0;
      local_468._16_8_ = local_450;
      local_468._0_8_ = (pointer)0x0;
      local_468._8_8_ = &DAT_00000001;
      local_450[0] = 0x2f;
      local_260.regmatch.startp[3] = &DAT_00000001;
      local_260.regmatch.startp[5] = (char *)0x0;
      local_260.regmatch.startp[7] = pbVar23[1]._M_dataplus._M_p;
      local_260.regmatch.startp[6] = (char *)pbVar23[1]._M_string_length;
      local_260.regmatch.startp[8] = (char *)0x0;
      views._M_len = 3;
      views._M_array = (iterator)&local_260;
      local_260.regmatch.startp[4] = (char *)local_468._16_8_;
      cmCatViews(&local_510,views);
      std::__cxx11::string::operator=((string *)&local_498,(string *)&local_510);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
    }
    local_478 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    local_51c = -1;
    local_56c = -1;
    local_260.regmust = (char *)0x0;
    local_260.program = (char *)0x0;
    local_260.progsize = 0;
    memset(&local_260,0,0x20a);
    pbVar23 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23;
    bVar6 = 0x60 < uVar16;
    local_4c8 = status;
    if (bVar6) {
      local_568 = (string *)&status->Error;
      bVar5 = true;
      local_528 = (char *)((ulong)local_528._4_4_ << 0x20);
      uVar16 = 3;
      uVar21 = 4;
      local_55c = 0;
      local_570 = 0;
      local_518 = 0;
      uVar25 = 0;
      local_558 = 0;
      local_550 = (pointer)CONCAT44(local_550._4_4_,(int)CONCAT71((int7)((ulong)local_568 >> 8),1));
      local_4c0 = 0;
LAB_002b91da:
      iVar8 = std::__cxx11::string::compare((char *)(pbVar23 + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 1;
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 2;
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 3;
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 4;
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 5;
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 7;
        goto LAB_002b977e;
      }
      uVar17 = std::__cxx11::string::compare
                         ((char *)((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if ((int)uVar17 == 0) {
        local_4c0 = CONCAT71((int7)((ulong)uVar17 >> 8),1);
        unaff_RBP = 0;
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      unaff_RBP = 0;
      if (iVar8 == 0) {
        local_550 = (pointer)((ulong)local_550 & 0xffffffff00000000);
        goto LAB_002b977e;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        unaff_RBP = 8;
        goto LAB_002b977e;
      }
      puVar19 = &switchD_002b92e2::switchdataD_007ff7c4;
      uVar12 = local_570;
      switch(uVar25) {
      case 1:
        unaff_RBP = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_51c);
        if ((iVar8 == 1) && (-1 < local_51c)) goto LAB_002b977e;
        cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)local_468,(char (*) [35])"STRINGS option LIMIT_INPUT value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar16,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign(local_568);
        break;
      case 2:
        unaff_RBP = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_56c);
        if ((iVar8 == 1) && (-1 < local_56c)) goto LAB_002b977e;
        cmStrCat<char_const(&)[36],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)local_468,(char (*) [36])"STRINGS option LIMIT_OUTPUT value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar16,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign(local_568);
        break;
      case 3:
        unaff_RBP = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_510);
        bVar7 = -1 < (int)(uint)local_510._M_dataplus._M_p && iVar8 == 1;
        uVar12 = (uint)local_510._M_dataplus._M_p;
        uVar14 = local_55c;
        if (-1 >= (int)(uint)local_510._M_dataplus._M_p || iVar8 != 1) {
          cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                    ((string *)local_468,(char (*) [35])"STRINGS option LIMIT_COUNT value \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar16,
                     (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign(local_568);
          if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
            operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
          }
          unaff_RBP = 3;
          uVar12 = local_570;
          uVar14 = local_55c;
        }
        goto LAB_002b9755;
      case 4:
        unaff_RBP = 0;
        iVar10 = __isoc99_sscanf((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p
                                 ,"%d",&local_510);
        bVar7 = -1 < (int)(uint)local_510._M_dataplus._M_p && iVar10 == 1;
        iVar8 = (uint)local_510._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_510._M_dataplus._M_p || iVar10 != 1) {
          cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                    ((string *)local_468,(char (*) [38])"STRINGS option LENGTH_MINIMUM value \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar16,
                     (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign(local_568);
          if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
            operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
          }
          unaff_RBP = 4;
          iVar8 = (int)local_528;
        }
        local_528 = (char *)CONCAT44(local_528._4_4_,iVar8);
        uVar14 = local_55c;
        goto LAB_002b9755;
      case 5:
        unaff_RBP = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_510);
        bVar7 = -1 < (int)(uint)local_510._M_dataplus._M_p && iVar8 == 1;
        uVar14 = (uint)local_510._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_510._M_dataplus._M_p || iVar8 != 1) {
          cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                    ((string *)local_468,(char (*) [38])"STRINGS option LENGTH_MAXIMUM value \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar16,
                     (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign(local_568);
          if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
            operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
          }
          unaff_RBP = 5;
          uVar14 = local_55c;
        }
LAB_002b9755:
        local_55c = uVar14;
        local_570 = uVar12;
        if (bVar7) goto LAB_002b977e;
        goto LAB_002b97e5;
      default:
        cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[2]>
                  ((string *)local_468,(char (*) [33])"STRINGS given unknown argument \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar16,(char (*) [2])0x8289ed);
        std::__cxx11::string::_M_assign(local_568);
        break;
      case 7:
        bVar7 = cmsys::RegularExpression::compile
                          (&local_260,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p);
        pcVar28 = local_4c8;
        if (bVar7) {
          PVar9 = cmMakefile::GetPolicyStatus(local_4c8->Makefile,CMP0159,false);
          local_518 = CONCAT71((int7)((ulong)puVar19 >> 8),1);
          if (PVar9 != OLD) {
            unaff_RBP = 0;
            if (PVar9 != WARN) goto LAB_002b977e;
            pcVar3 = pcVar28->Makefile;
            local_468._0_8_ = local_468 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_468,"CMAKE_POLICY_WARNING_CMP0159","");
            bVar6 = cmMakefile::PolicyOptionalWarningEnabled(pcVar3,(string *)local_468);
            id = extraout_EDX;
            if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
              operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              id = extraout_EDX_00;
            }
            if (bVar6) {
              pcVar3 = pcVar28->Makefile;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_510,(cmPolicies *)0x9f,id);
              local_548._M_dataplus._M_p._0_1_ = 10;
              cmStrCat<std::__cxx11::string,char,char_const(&)[63]>
                        ((string *)local_468,&local_510,(char *)&local_548,
                         (char (*) [63])
                         "For compatibility, CMake is leaving CMAKE_MATCH_<n> unchanged.");
              cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_468);
              if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != &local_510.field_2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
            }
          }
          unaff_RBP = 0;
          bVar5 = false;
          goto LAB_002b977e;
        }
        cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[25]>
                  ((string *)local_468,(char (*) [29])"STRINGS option REGEX value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar16,
                   (char (*) [25])"\" could not be compiled.");
        std::__cxx11::string::_M_assign(local_568);
        break;
      case 8:
        iVar8 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar16));
        if (iVar8 == 0) {
          local_558 = 1;
        }
        else {
          iVar8 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar16));
          if (iVar8 == 0) {
            local_558 = 3;
          }
          else {
            iVar8 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar16));
            if (iVar8 == 0) {
              local_558 = 2;
            }
            else {
              iVar8 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar16));
              if (iVar8 == 0) {
                local_558 = 5;
              }
              else {
                iVar8 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar16));
                if (iVar8 != 0) {
                  cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[18]>
                            ((string *)local_468,(char (*) [26])"STRINGS option ENCODING \"",
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar16,
                             (char (*) [18])"\" not recognized.");
                  std::__cxx11::string::_M_assign(local_568);
                  break;
                }
                local_558 = 4;
              }
            }
          }
        }
        goto LAB_002b977e;
      }
      unaff_RBP = 0;
      if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
      }
      goto LAB_002b97e5;
    }
    local_558 = 0;
    local_550 = (pointer)CONCAT44(local_550._4_4_,(int)CONCAT71((int7)(uVar16 >> 8),1));
    local_4c0 = 0;
    bVar5 = true;
    local_518 = 0;
    local_570 = 0;
    local_55c = 0;
    local_528 = (char *)((ulong)local_528._4_4_ << 0x20);
LAB_002b97e5:
    pcVar28 = local_4c8;
    uVar17 = local_558;
    if (bVar6) {
      uVar24 = 0;
    }
    else {
      if (((ulong)local_550 & 1) != 0) {
        psVar15 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_4c8->Makefile);
        local_468._8_8_ = (psVar15->_M_dataplus)._M_p;
        local_468._0_8_ = psVar15->_M_string_length;
        local_468._16_8_ = (char *)0x0;
        local_450[0] = '(';
        local_450[1] = '\0';
        local_450[2] = '\0';
        local_450[3] = '\0';
        local_450[4] = '\0';
        local_450[5] = '\0';
        local_450[6] = '\0';
        local_450[7] = '\0';
        local_448 = "/CMakeFiles/FileCommandStringsBinaryFile";
        local_440 = 0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_468;
        cmCatViews(&local_510,views_00);
        bVar6 = cmHexFileConverter::TryConvert(&local_498,&local_510);
        if (bVar6) {
          std::__cxx11::string::_M_assign((string *)&local_498);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
      }
      std::ifstream::ifstream(local_468,local_498._M_dataplus._M_p,_S_in);
      bVar6 = (*(byte *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) == 0;
      uVar16 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar6);
      if (bVar6) {
        local_49c = (uint)uVar16;
        BVar11 = cmsys::FStream::ReadBOM((istream *)local_468);
        local_478 = local_478 + 2;
        BVar22 = (BOM)uVar17;
        if (BVar11 == BOM_None) {
          BVar11 = BVar22;
        }
        if (BVar22 != BOM_None) {
          BVar11 = BVar22;
        }
        local_558 = CONCAT44(local_558._4_4_,BVar11);
        uVar21 = 3;
        if ((BVar11 & ~BOM_UTF8) != BOM_UTF32BE) {
          uVar21 = (uint)((BVar11 & ~BOM_UTF8) == BOM_UTF16BE);
        }
        local_4b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        local_510._M_string_length = 0;
        local_510.field_2._M_allocated_capacity =
             local_510.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_568 = (string *)(ulong)local_570;
        local_528 = (char *)((ulong)local_528 & 0xffffffff);
        local_470 = (char *)(ulong)local_55c;
        pbVar23 = (pointer)0x0;
        do {
          if ((((local_570 != 0) &&
               (local_568 <=
                (string *)
                ((long)local_4b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5))) ||
              ((-1 < local_51c && (iVar8 = std::istream::tellg(), local_51c <= iVar8)))) ||
             ((*(byte *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) != 0)) break;
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          local_548._M_string_length = 0;
          local_548.field_2._M_local_buf[0] = '\0';
          uVar12 = std::istream::get();
          cVar26 = (char)local_468;
          local_550 = pbVar23;
          if (uVar21 != 0) {
            uVar14 = 1;
            do {
              uVar13 = std::istream::get();
              uVar20 = *(uint *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18));
              if ((uVar20 & 5) == 0) {
                uVar12 = uVar12 << 8 | uVar13;
              }
              else {
                std::istream::putback(cVar26);
              }
            } while (((uVar20 & 5) == 0) && (bVar6 = uVar14 < uVar21, uVar14 = uVar14 + 1, bVar6));
          }
          pbVar23 = local_550;
          if ((int)local_558 == 5) {
            uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                     uVar12 << 0x18;
          }
          else if ((int)local_558 == 3) {
            uVar12 = (uint)(ushort)((ushort)uVar12 << 8 | (ushort)uVar12 >> 8);
          }
          if (uVar12 == 0xd) {
LAB_002b9e20:
            bVar6 = false;
          }
          else {
            if (uVar12 < 0x100) {
              iVar8 = isprint(uVar12);
              if ((byte)(uVar12 == 10 & (byte)local_4c0 | (uVar12 == 9 || iVar8 != 0)) != 1)
              goto LAB_002b9b3a;
              std::__cxx11::string::push_back((char)&local_548);
            }
            else {
LAB_002b9b3a:
              if ((int)local_558 == 1) {
                uVar16 = 0;
                do {
                  uVar14 = HandleStringsCommand::utf8_check_table[uVar16][0] & uVar12;
                  uVar18 = uVar16 + 1;
                  uVar20 = (uint)HandleStringsCommand::utf8_check_table[uVar16][1];
                  if (uVar14 == uVar20) break;
                  bVar6 = uVar16 < 2;
                  uVar16 = uVar18;
                } while (bVar6);
                uVar13 = (int)uVar18 + 1;
                if (uVar14 != uVar20) {
                  uVar13 = 0;
                }
                if (uVar14 == uVar20) {
                  iVar8 = 0;
                  do {
                    if ((iVar8 != 0) &&
                       ((uVar12 = std::istream::get(), (uVar12 & 0xc0) != 0x80 ||
                        ((*(uint *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) != 0
                        )))) {
                      std::istream::putback(cVar26);
                      break;
                    }
                    std::__cxx11::string::push_back((char)&local_548);
                    iVar8 = iVar8 + 1;
                  } while (uVar13 + (uVar13 == 0) != iVar8);
                }
                pcVar28 = local_4c8;
                pbVar23 = local_550;
                if (local_548._M_string_length != uVar13) {
                  if (local_548._M_string_length != 1) {
                    uVar16 = 1;
                    do {
                      std::istream::putback(cVar26);
                      bVar6 = uVar16 < local_548._M_string_length - 1;
                      uVar16 = (ulong)((int)uVar16 + 1);
                    } while (bVar6);
                  }
                  local_548._M_string_length = 0;
                  *local_548._M_dataplus._M_p = '\0';
                }
              }
            }
            if (uVar12 == 10 && (local_4c0 & 1) == 0) {
              if ((local_510._M_string_length < local_528) ||
                 (((local_518 & 1) != 0 &&
                  (bVar6 = cmsys::RegularExpression::find
                                     (&local_260,local_510._M_dataplus._M_p,&local_260.regmatch),
                  !bVar6)))) {
LAB_002b9d8c:
                local_510._M_string_length = 0;
                *local_510._M_dataplus._M_p = '\0';
                goto LAB_002b9d9d;
              }
              if (bVar5) {
                cmMakefile::ClearMatches(pcVar28->Makefile);
                cmMakefile::StoreMatches(pcVar28->Makefile,&local_260);
              }
              uVar12 = (int)pbVar23 + (int)local_510._M_string_length + 1;
              pbVar23 = (pointer)(ulong)uVar12;
              if ((local_56c < 0) || ((int)uVar12 < local_56c)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4b8,&local_510);
                goto LAB_002b9d8c;
              }
LAB_002b9e12:
              bVar6 = true;
            }
            else {
              if (local_548._M_string_length == 0) {
                if (((char *)local_510._M_string_length != (char *)0x0 &&
                     local_528 <= local_510._M_string_length) &&
                   (((local_518 & 1) == 0 ||
                    (bVar6 = cmsys::RegularExpression::find
                                       (&local_260,local_510._M_dataplus._M_p,&local_260.regmatch),
                    bVar6)))) {
                  if (bVar5) {
                    cmMakefile::ClearMatches(pcVar28->Makefile);
                    cmMakefile::StoreMatches(pcVar28->Makefile,&local_260);
                  }
                  uVar12 = (int)pbVar23 + (int)local_510._M_string_length + 1;
                  pbVar23 = (pointer)(ulong)uVar12;
                  if ((-1 < local_56c) && (local_56c <= (int)uVar12)) goto LAB_002b9e12;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_4b8,&local_510);
                }
                goto LAB_002b9d8c;
              }
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_548._M_dataplus._M_p);
LAB_002b9d9d:
              if ((local_55c == 0) || ((char *)local_510._M_string_length != local_470))
              goto LAB_002b9e20;
              if ((local_528 <= local_510._M_string_length) &&
                 (((local_518 & 1) == 0 ||
                  (bVar6 = cmsys::RegularExpression::find
                                     (&local_260,local_510._M_dataplus._M_p,&local_260.regmatch),
                  bVar6)))) {
                if (bVar5) {
                  cmMakefile::ClearMatches(pcVar28->Makefile);
                  cmMakefile::StoreMatches(pcVar28->Makefile,&local_260);
                }
                uVar12 = (int)pbVar23 + (int)local_510._M_string_length + 1;
                pbVar23 = (pointer)(ulong)uVar12;
                if ((-1 < local_56c) && (local_56c <= (int)uVar12)) goto LAB_002b9e12;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4b8,&local_510);
              }
              bVar6 = false;
            }
            local_510._M_string_length = 0;
            *local_510._M_dataplus._M_p = '\0';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,
                            CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                     local_548.field_2._M_local_buf[0]) + 1);
          }
        } while (!bVar6);
        if (((((local_570 == 0) ||
              ((string *)
               ((long)local_4b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_4b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < local_568)) &&
             ((char *)local_510._M_string_length != (char *)0x0)) &&
            (local_528 <= local_510._M_string_length)) &&
           (((local_518 & 1) == 0 ||
            (bVar6 = cmsys::RegularExpression::find
                               (&local_260,local_510._M_dataplus._M_p,&local_260.regmatch), bVar6)))
           ) {
          if (bVar5) {
            cmMakefile::ClearMatches(pcVar28->Makefile);
            cmMakefile::StoreMatches(pcVar28->Makefile,&local_260);
          }
          if ((local_56c < 0) || ((int)local_510._M_string_length + (int)pbVar23 + 1 < local_56c)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_4b8,&local_510);
          }
        }
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        local_548._M_string_length = 0;
        local_548.field_2._M_local_buf[0] = '\0';
        local_550 = local_4b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar23 = local_4b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::__cxx11::string::append((char *)&local_548);
            sVar4 = pbVar23->_M_string_length;
            if (sVar4 != 0) {
              pcVar2 = (pbVar23->_M_dataplus)._M_p;
              sVar27 = 0;
              do {
                cVar26 = (char)&local_548;
                if (pcVar2[sVar27] == ';') {
                  std::__cxx11::string::push_back(cVar26);
                }
                std::__cxx11::string::push_back(cVar26);
                sVar27 = sVar27 + 1;
              } while (sVar4 != sVar27);
            }
            pbVar23 = pbVar23 + 1;
          } while (pbVar23 != local_550);
        }
        value._M_str = local_548._M_dataplus._M_p;
        value._M_len = local_548._M_string_length;
        cmMakefile::AddDefinition(local_4c8->Makefile,local_478,value);
        uVar16 = (ulong)local_49c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,
                          CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                   local_548.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4b8);
      }
      else {
        local_510._M_dataplus._M_p = (pointer)0xe;
        local_510._M_string_length = 0x8025c6;
        local_510.field_2._M_allocated_capacity = 0;
        local_510.field_2._8_8_ = local_498._M_string_length;
        local_4f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_dataplus._M_p;
        local_4e8 = 0;
        local_4e0 = 0x11;
        local_4d8 = "\" cannot be read.";
        local_4d0 = 0;
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_510;
        cmCatViews(&local_548,views_01);
        std::__cxx11::string::_M_assign((string *)&pcVar28->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,
                          CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                   local_548.field_2._M_local_buf[0]) + 1);
        }
      }
      uVar24 = (undefined1)uVar16;
      std::ifstream::~ifstream(local_468);
    }
    if (local_260.program != (char *)0x0) {
      operator_delete__(local_260.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar24;
LAB_002b977e:
  uVar16 = (ulong)uVar21;
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar18 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23 >> 5;
  uVar21 = uVar21 + 1;
  uVar25 = (undefined4)unaff_RBP;
  bVar6 = uVar16 < uVar18;
  if (uVar18 <= uVar16) goto LAB_002b97e5;
  goto LAB_002b91da;
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool store_regex = true;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0159)) {
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          // store_regex = true
          break;
        case cmPolicies::WARN:
          if (status.GetMakefile().PolicyOptionalWarningEnabled(
                "CMAKE_POLICY_WARNING_CMP0159")) {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0159), '\n',
                       "For compatibility, CMake is leaving CMAKE_MATCH_<n> "
                       "unchanged."));
          }
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          store_regex = false;
          break;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    if (store_regex) {
      status.GetMakefile().ClearMatches();
      status.GetMakefile().StoreMatches(regex);
    }
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}